

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> * __thiscall
chaiscript::dispatch::detail::
build_param_type_list<chaiscript::Boxed_Value_const&,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,detail *this,
          _func_Boxed_Value_ptr_Dynamic_Object_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *param_1)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_51;
  Type_Info local_50;
  pointer_____offset_0x10___ *local_38;
  pointer_____offset_0x10___ *local_30;
  uint local_28;
  pointer_____offset_0x10___ *local_20;
  pointer_____offset_0x10___ *local_18;
  uint local_10;
  
  local_50.m_type_info = (type_info *)&Boxed_Value::typeinfo;
  local_50.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
  local_50.m_flags = 3;
  local_38 = &Dynamic_Object::typeinfo;
  local_30 = &Dynamic_Object::typeinfo;
  local_20 = &std::__cxx11::string::typeinfo;
  local_18 = &std::__cxx11::string::typeinfo;
  __l._M_len = 3;
  __l._M_array = &local_50;
  local_28 = local_50.m_flags;
  local_10 = local_50.m_flags;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (__return_storage_ptr__,__l,&local_51);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }